

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_bytearray_t * adt_str_bytearray(adt_str_t *self)

{
  uint32_t u32NewLen;
  adt_error_t aVar1;
  uint32_t uVar2;
  uint8_t *__dest;
  uint32_t u32Size;
  adt_error_t result;
  adt_bytearray_t *retval;
  adt_str_t *self_local;
  
  _u32Size = (adt_bytearray_t *)0x0;
  if ((self != (adt_str_t *)0x0) &&
     (_u32Size = adt_bytearray_new(0), _u32Size != (adt_bytearray_t *)0x0)) {
    u32NewLen = self->s32Cur;
    aVar1 = adt_bytearray_resize(_u32Size,u32NewLen);
    if (aVar1 == '\0') {
      uVar2 = adt_bytearray_length(_u32Size);
      if (uVar2 != u32NewLen) {
        __assert_fail("adt_bytearray_length(retval) == u32Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                      ,0x25f,"adt_bytearray_t *adt_str_bytearray(adt_str_t *)");
      }
      __dest = adt_bytearray_data(_u32Size);
      memcpy(__dest,self->pAlloc,(long)self->s32Cur);
    }
    else {
      adt_bytearray_delete(_u32Size);
      _u32Size = (adt_bytearray_t *)0x0;
    }
  }
  return _u32Size;
}

Assistant:

adt_bytearray_t *adt_str_bytearray(adt_str_t *self)
{
   adt_bytearray_t *retval = (adt_bytearray_t*) 0;
   if (self != 0)
   {
      retval = adt_bytearray_new(ADT_BYTE_ARRAY_NO_GROWTH);
      if (retval != 0)
      {
         adt_error_t result;
         uint32_t u32Size = (uint32_t) self->s32Cur;
         result = adt_bytearray_resize(retval, u32Size);
         if (result == ADT_NO_ERROR)
         {
            assert(adt_bytearray_length(retval) == u32Size);
            memcpy(adt_bytearray_data(retval), self->pAlloc, (size_t) self->s32Cur);
         }
         else
         {
            adt_bytearray_delete(retval);
            retval = (adt_bytearray_t*) 0;
         }
      }
   }
   return retval;
}